

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

uint64_t round_to_uint_and_pack(FloatParts in,int rmode,int scale,uint64_t max,float_status *s)

{
  byte bVar1;
  ulong uVar2;
  FloatParts FVar3;
  
  bVar1 = s->float_exception_flags;
  FVar3 = round_to_int(in,rmode,scale,s);
  switch(FVar3._12_4_ & 0xff) {
  case 2:
    if ((FVar3._8_8_ >> 0x28 & 1) == 0) {
      if (FVar3.exp < 0x3e) {
        uVar2 = FVar3.frac >> (0x3eU - (char)FVar3.exp & 0x3f);
      }
      else {
        if (0x3f < (uint)FVar3.exp) goto switchD_00b17566_caseD_4;
        uVar2 = FVar3.frac << ((char)FVar3.exp - 0x3eU & 0x3f);
      }
      if (uVar2 <= max) {
        return uVar2;
      }
      goto switchD_00b17566_caseD_4;
    }
    s->float_exception_flags = bVar1 | 1;
  case 1:
    max = 0;
    break;
  case 3:
    s->float_exception_flags = bVar1 | 1;
    if ((FVar3._8_8_ >> 0x28 & 1) != 0) {
      return 0;
    }
    return max;
  case 4:
  case 5:
switchD_00b17566_caseD_4:
    s->float_exception_flags = bVar1 | 1;
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
               ,0x962,(char *)0x0);
  }
  return max;
}

Assistant:

static uint64_t round_to_uint_and_pack(FloatParts in, int rmode, int scale,
                                       uint64_t max, float_status *s)
{
    int orig_flags = get_float_exception_flags(s);
    FloatParts p = round_to_int(in, rmode, scale, s);
    uint64_t r;

    switch (p.cls) {
    case float_class_snan:
    case float_class_qnan:
        s->float_exception_flags = orig_flags | float_flag_invalid;
        return max;
    case float_class_inf:
        s->float_exception_flags = orig_flags | float_flag_invalid;
        return p.sign ? 0 : max;
    case float_class_zero:
        return 0;
    case float_class_normal:
        if (p.sign) {
            s->float_exception_flags = orig_flags | float_flag_invalid;
            return 0;
        }

        if (p.exp < DECOMPOSED_BINARY_POINT) {
            r = p.frac >> (DECOMPOSED_BINARY_POINT - p.exp);
        } else if (p.exp - DECOMPOSED_BINARY_POINT < 2) {
            r = p.frac << (p.exp - DECOMPOSED_BINARY_POINT);
        } else {
            s->float_exception_flags = orig_flags | float_flag_invalid;
            return max;
        }

        /* For uint64 this will never trip, but if p.exp is too large
         * to shift a decomposed fraction we shall have exited via the
         * 3rd leg above.
         */
        if (r > max) {
            s->float_exception_flags = orig_flags | float_flag_invalid;
            return max;
        }
        return r;
    default:
        g_assert_not_reached();
        return max;
    }
}